

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

BVFixed * BVFixed::New<Memory::JitArenaAllocator>
                    (BVIndex length,JitArenaAllocator *alloc,bool initialSet)

{
  BVIndex BVar1;
  JitArenaAllocator *alloc_00;
  BVFixed *this;
  TrackAllocData local_50;
  BVFixed *result;
  JitArenaAllocator *pJStack_18;
  bool initialSet_local;
  JitArenaAllocator *alloc_local;
  BVIndex length_local;
  
  result._7_1_ = initialSet;
  pJStack_18 = alloc;
  alloc_local._4_4_ = length;
  BVar1 = WordCount(length);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,(ulong)BVar1 << 3,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
             ,0x9e);
  alloc_00 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            alloc,&local_50);
  WordCount(alloc_local._4_4_);
  this = (BVFixed *)new<Memory::JitArenaAllocator>(8,alloc_00,0x4f37c0,0);
  BVFixed(this,alloc_local._4_4_,(bool)(result._7_1_ & 1));
  return this;
}

Assistant:

BVFixed * BVFixed::New(DECLSPEC_GUARD_OVERFLOW BVIndex length, TAllocator * alloc, bool initialSet)
{
    BVFixed *result = AllocatorNewPlusLeaf(TAllocator, alloc, sizeof(BVUnit) * BVFixed::WordCount(length), BVFixed, length, initialSet);
    return result;
}